

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweeper.c
# Opt level: O0

int Gia_SweeperProbeUpdate(Gia_Man_t *p,int ProbeId,int iLitNew)

{
  void *pvVar1;
  int iVar2;
  int iLit;
  Swp_Man_t *pSwp;
  int iLitNew_local;
  int ProbeId_local;
  Gia_Man_t *p_local;
  
  pvVar1 = p->pData;
  iVar2 = Vec_IntEntry(*(Vec_Int_t **)((long)pvVar1 + 0x10),ProbeId);
  if (-1 < iVar2) {
    Vec_IntWriteEntry(*(Vec_Int_t **)((long)pvVar1 + 0x10),ProbeId,iLitNew);
    return iVar2;
  }
  __assert_fail("iLit >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSweeper.c"
                ,0x10f,"int Gia_SweeperProbeUpdate(Gia_Man_t *, int, int)");
}

Assistant:

int Gia_SweeperProbeUpdate( Gia_Man_t * p, int ProbeId, int iLitNew )
{
    Swp_Man_t * pSwp = (Swp_Man_t *)p->pData;
    int iLit = Vec_IntEntry(pSwp->vProbes, ProbeId);
    assert( iLit >= 0 );
    Vec_IntWriteEntry(pSwp->vProbes, ProbeId, iLitNew);
    return iLit;
}